

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_client.cpp
# Opt level: O2

void __thiscall
miniros::ServiceClient::ServiceClient
          (ServiceClient *this,string *service_name,bool persistent,M_string *header_values,
          string *service_md5sum)

{
  element_type *peVar1;
  Impl *this_00;
  ServiceManagerPtr *pSVar2;
  
  this_00 = (Impl *)operator_new(0x90);
  Impl::Impl(this_00);
  std::__shared_ptr<miniros::ServiceClient::Impl,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<miniros::ServiceClient::Impl,void>
            ((__shared_ptr<miniros::ServiceClient::Impl,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  std::__cxx11::string::_M_assign
            ((string *)
             &((this->impl_).
               super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->name_);
  peVar1 = (this->impl_).
           super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar1->persistent_ = persistent;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&(peVar1->header_values_)._M_t,&header_values->_M_t);
  std::__cxx11::string::_M_assign
            ((string *)
             &((this->impl_).
               super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->service_md5sum_);
  if (persistent) {
    pSVar2 = ServiceManager::instance();
    peVar1 = (this->impl_).
             super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    ServiceManager::createServiceServerLink
              ((ServiceManager *)&stack0xffffffffffffffc0,
               (string *)
               (pSVar2->super___shared_ptr<miniros::ServiceManager,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr,(bool)((char)peVar1 + '\x10'),(string *)(ulong)peVar1->persistent_,
               &peVar1->service_md5sum_,(M_string *)&peVar1->service_md5sum_);
    std::__shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2> *)
               (this->impl_).
               super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (__shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2> *)
               &stack0xffffffffffffffc0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
  }
  return;
}

Assistant:

ServiceClient::ServiceClient(const std::string& service_name, bool persistent, const M_string& header_values, const std::string& service_md5sum)
: impl_(new Impl)
{
  impl_->name_ = service_name;
  impl_->persistent_ = persistent;
  impl_->header_values_ = header_values;
  impl_->service_md5sum_ = service_md5sum;

  if (persistent)
  {
    impl_->server_link_ = ServiceManager::instance()->createServiceServerLink(impl_->name_, impl_->persistent_, impl_->service_md5sum_, impl_->service_md5sum_, impl_->header_values_);
  }
}